

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackPropertiesGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackPropertiesGenerator::GenerateScriptForConfig
          (cmCPackPropertiesGenerator *this,ostream *os,string *config,Indent *indent)

{
  cmMakefile *pcVar1;
  Indent *pIVar2;
  bool bVar3;
  cmCompiledGeneratorExpression *pcVar4;
  char *pcVar5;
  pointer ppVar6;
  ostream *poVar7;
  reference ppcVar8;
  string local_160;
  allocator local_139;
  string local_138;
  undefined1 local_118 [8];
  string value;
  __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
  local_f0;
  const_iterator j;
  string local_c8;
  Property *local_a8;
  Property *property;
  string *name;
  _Self local_90;
  const_iterator i;
  PropertyMapType *properties;
  string local_70;
  string local_50;
  string *local_30;
  string *expandedFileName;
  Indent *indent_local;
  string *config_local;
  ostream *os_local;
  cmCPackPropertiesGenerator *this_local;
  
  expandedFileName = (string *)indent;
  indent_local = (Indent *)config;
  config_local = (string *)os;
  os_local = (ostream *)this;
  pcVar4 = cmInstalledFile::GetNameExpression(this->InstalledFile);
  pIVar2 = indent_local;
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&local_70);
  pcVar5 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar4,pcVar1,(string *)pIVar2,false,(cmTarget *)0x0,(cmTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,&local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,pcVar5,(allocator *)((long)&properties + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&properties + 3));
  std::__cxx11::string::~string((string *)&local_70);
  local_30 = &local_50;
  i._M_node = (_Base_ptr)cmInstalledFile::GetProperties_abi_cxx11_(this->InstalledFile);
  local_90._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
                *)i._M_node);
  while( true ) {
    name = (string *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
                  *)i._M_node);
    bVar3 = std::operator!=(&local_90,(_Self *)&name);
    if (!bVar3) break;
    property = (Property *)
               std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
               ::operator->(&local_90);
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
             ::operator->(&local_90);
    local_a8 = &ppVar6->second;
    poVar7 = ::operator<<((ostream *)config_local,(cmScriptGeneratorIndent *)expandedFileName);
    poVar7 = std::operator<<(poVar7,"set_property(INSTALL ");
    cmOutputConverter::EscapeForCMake(&local_c8,local_30);
    poVar7 = std::operator<<(poVar7,(string *)&local_c8);
    poVar7 = std::operator<<(poVar7," PROPERTY ");
    cmOutputConverter::EscapeForCMake((string *)&j,(string *)property);
    std::operator<<(poVar7,(string *)&j);
    std::__cxx11::string::~string((string *)&j);
    std::__cxx11::string::~string((string *)&local_c8);
    local_f0._M_current =
         (cmCompiledGeneratorExpression **)
         std::
         vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>::
         begin(&local_a8->ValueExpressions);
    while( true ) {
      value.field_2._8_8_ =
           std::
           vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>
           ::end(&local_a8->ValueExpressions);
      bVar3 = __gnu_cxx::operator!=
                        (&local_f0,
                         (__normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
                          *)((long)&value.field_2 + 8));
      if (!bVar3) break;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
                ::operator*(&local_f0);
      pIVar2 = indent_local;
      pcVar4 = *ppcVar8;
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&local_138);
      pcVar5 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar4,pcVar1,(string *)pIVar2,false,(cmTarget *)0x0,(cmTarget *)0x0,
                          (cmGeneratorExpressionDAGChecker *)0x0,&local_138);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_118,pcVar5,&local_139);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      std::__cxx11::string::~string((string *)&local_138);
      poVar7 = std::operator<<((ostream *)config_local," ");
      cmOutputConverter::EscapeForCMake(&local_160,(string *)local_118);
      std::operator<<(poVar7,(string *)&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)local_118);
      __gnu_cxx::
      __normal_iterator<cmCompiledGeneratorExpression_*const_*,_std::vector<cmCompiledGeneratorExpression_*,_std::allocator<cmCompiledGeneratorExpression_*>_>_>
      ::operator++(&local_f0);
    }
    std::operator<<((ostream *)config_local,")\n");
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>
    ::operator++(&local_90);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmCPackPropertiesGenerator::GenerateScriptForConfig(std::ostream& os,
  const std::string& config, Indent const& indent)
{
  std::string const& expandedFileName =
      this->InstalledFile.GetNameExpression().Evaluate(this->Makefile, config);

  cmInstalledFile::PropertyMapType const& properties =
    this->InstalledFile.GetProperties();

  for(cmInstalledFile::PropertyMapType::const_iterator i = properties.begin();
    i != properties.end(); ++i)
    {
    std::string const& name = i->first;
    cmInstalledFile::Property const& property = i->second;

    os << indent << "set_property(INSTALL " <<
      cmOutputConverter::EscapeForCMake(expandedFileName) << " PROPERTY " <<
      cmOutputConverter::EscapeForCMake(name);

    for(cmInstalledFile::ExpressionVectorType::const_iterator
      j = property.ValueExpressions.begin();
      j != property.ValueExpressions.end(); ++j)
      {
      std::string value = (*j)->Evaluate(this->Makefile, config);
      os << " " << cmOutputConverter::EscapeForCMake(value);
      }

    os << ")\n";
    }
}